

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_GeneratorNoEditionsSupport_Test
::CommandLineInterfaceTest_GeneratorNoEditionsSupport_Test
          (CommandLineInterfaceTest_GeneratorNoEditionsSupport_Test *this)

{
  CommandLineInterfaceTest_GeneratorNoEditionsSupport_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__CommandLineInterfaceTest_GeneratorNoEditionsSupport_Test_029fad30;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, GeneratorNoEditionsSupport) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2023";
    message Foo {
      int32 i = 1;
    }
  )schema");

  CreateGeneratorWithMissingFeatures("--no_editions_out",
                                     "Doesn't support editions",
                                     CodeGenerator::FEATURE_SUPPORTS_EDITIONS);

  Run("protocol_compiler "
      "--proto_path=$tmpdir foo.proto --no_editions_out=$tmpdir");

  ExpectErrorSubstring(
      "code generator --no_editions_out hasn't been updated to support "
      "editions");
}